

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeCost
          (CostAttributes *this,IndexRange *selectedRange,uint totalDimension)

{
  __shared_ptr<iDynTree::optimalcontrol::IndexSelector,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::
  make_shared<iDynTree::optimalcontrol::IndexSelector,iDynTree::IndexRange_const&,unsigned_int&>
            ((IndexRange *)&local_30,(uint *)selectedRange);
  std::__shared_ptr<iDynTree::optimalcontrol::Selector,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<iDynTree::optimalcontrol::Selector,(__gnu_cxx::_Lock_policy)2> *)
             &this->selector,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  initializeBuffers(this,(uint)selectedRange->size,totalDimension);
  return;
}

Assistant:

void initializeCost(const IndexRange& selectedRange, unsigned int totalDimension) {
                this->selector = std::make_shared<IndexSelector>(selectedRange, totalDimension);
                unsigned int rangeSize = static_cast<unsigned int>(selectedRange.size);
                initializeBuffers(rangeSize, totalDimension);
            }